

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O1

void pzgeom::TPZQuadraticTetra::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  Fad<double> *pFVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  Fad<double> qsi;
  Fad<double> eta;
  Fad<double> zeta;
  undefined1 local_178 [16];
  double dStack_168;
  Fad<double> *local_160;
  Fad<double> local_158;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_138;
  Fad<double> local_118;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> local_f8;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_d8;
  Fad<double> local_c8;
  undefined1 local_a8 [8];
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *local_a0;
  double *pdStack_98;
  undefined1 local_90 [8];
  double local_88;
  double dStack_80;
  Fad<double> *local_78;
  undefined1 *local_70;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *local_68;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_60;
  Fad<double> *local_50;
  Fad<double> *local_48;
  Fad<double> **local_40;
  Fad<double> *local_38;
  
  pFVar2 = par->fStore;
  local_158.val_ = pFVar2->val_;
  uVar1 = (pFVar2->dx_).num_elts;
  local_158.dx_.ptr_to_data = (double *)0x0;
  local_158.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (long)(int)uVar1 << 3;
    }
    local_158.dx_.ptr_to_data = (double *)operator_new__(uVar8);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_158.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_158.defaultVal = pFVar2->defaultVal;
  pFVar2 = par->fStore;
  local_118.val_ = pFVar2[1].val_;
  uVar1 = pFVar2[1].dx_.num_elts;
  local_118.dx_.ptr_to_data = (double *)0x0;
  local_118.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (long)(int)uVar1 * 8;
    }
    local_118.dx_.ptr_to_data = (double *)operator_new__(uVar8);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_118.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)pFVar2[1].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_118.defaultVal = pFVar2[1].defaultVal;
  pFVar2 = par->fStore;
  local_c8.val_ = pFVar2[2].val_;
  uVar1 = pFVar2[2].dx_.num_elts;
  local_c8.dx_.ptr_to_data = (double *)0x0;
  local_c8.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar8 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar8 = (long)(int)uVar1 * 8;
    }
    local_c8.dx_.ptr_to_data = (double *)operator_new__(uVar8);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_c8.dx_.ptr_to_data,(EVP_PKEY_CTX *)pFVar2[2].dx_.ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_c8.defaultVal = pFVar2[2].defaultVal;
  local_160 = &local_c8;
  local_40 = &local_50;
  local_138.fadexpr_.right_ = &local_118;
  local_90 = (undefined1  [8])&local_40;
  local_f8.fadexpr_.right_ = &local_158;
  local_88 = 1.0;
  dStack_80 = 0.0;
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_138.fadexpr_.left_.constant_ = 2.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_60.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_70;
  local_60.fadexpr_.right_ = &local_f8;
  local_f8.fadexpr_.left_.constant_ = 2.0;
  local_f8.fadexpr_.left_.defaultVal = 0.0;
  local_a8 = (undefined1  [8])&local_60;
  local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pdStack_98 = (double *)0x0;
  local_d8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_90;
  local_d8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_a8;
  local_68 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)&local_138;
  local_50 = local_160;
  local_48 = local_138.fadexpr_.right_;
  local_38 = local_f8.fadexpr_.right_;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_70 = local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_70 = local_178;
  Fad<double>::operator=
            (phi->fElem,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
              *)&local_d8);
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_160 = &local_158;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_f8._0_8_ = local_160;
  local_f8.fadexpr_.left_.constant_ = (double)&local_138;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = local_178;
  Fad<double>::operator=
            (phi->fElem + 1,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)&local_f8);
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_160 = &local_118;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_f8._0_8_ = local_160;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = local_178;
    local_f8.fadexpr_.left_.constant_ = (double)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = local_178;
  local_f8.fadexpr_.left_.constant_ = (double)&local_138;
  Fad<double>::operator=
            (phi->fElem + 2,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)&local_f8);
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_160 = &local_c8;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_f8._0_8_ = local_160;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = local_178;
    local_f8.fadexpr_.left_.constant_ = (double)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = local_178;
  local_f8.fadexpr_.left_.constant_ = (double)&local_138;
  Fad<double>::operator=
            (phi->fElem + 3,
             (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)&local_f8);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &local_158;
  local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_118;
  local_88 = (double)&local_c8;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
  local_a8 = (undefined1  [8])local_160;
  local_90 = (undefined1  [8])local_a8;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_f8._0_8_ = local_178;
    local_f8.fadexpr_.left_.constant_ = (double)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_f8._0_8_ = local_178;
  local_f8.fadexpr_.left_.constant_ = (double)&local_138;
  Fad<double>::operator=
            (phi->fElem + 4,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)&local_f8);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &local_158;
  local_138.fadexpr_.left_.constant_ = (double)&local_118;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 6) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = local_178;
  Fad<double>::operator=
            (phi->fElem + 5,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_138);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &local_118;
  local_a8 = (undefined1  [8])&local_158;
  local_88 = (double)&local_c8;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_f8.fadexpr_.left_.constant_ = (double)&local_138;
  local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_160;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 7) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
    local_f8._0_8_ = local_178;
    local_90 = (undefined1  [8])local_a8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
  local_f8._0_8_ = local_178;
  local_90 = (undefined1  [8])local_a8;
  Fad<double>::operator=
            (phi->fElem + 6,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)&local_f8);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_a8 = (undefined1  [8])&local_158;
  local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_118;
  local_138.fadexpr_.left_.constant_ = 1.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_160 = &local_c8;
  local_88 = (double)&local_c8;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 8) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
    local_f8._0_8_ = local_178;
    local_f8.fadexpr_.left_.constant_ = (double)&local_138;
    local_90 = (undefined1  [8])local_a8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
  local_f8._0_8_ = local_178;
  local_f8.fadexpr_.left_.constant_ = (double)&local_138;
  local_90 = (undefined1  [8])local_a8;
  Fad<double>::operator=
            (phi->fElem + 7,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
              *)&local_f8);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &local_158;
  local_138.fadexpr_.left_.constant_ = (double)&local_c8;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 9) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = local_178;
  Fad<double>::operator=
            (phi->fElem + 8,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_138);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &local_118;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 10) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_138._0_8_ = local_178;
    local_138.fadexpr_.left_.constant_ = (double)&local_c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_138._0_8_ = local_178;
  local_138.fadexpr_.left_.constant_ = (double)&local_c8;
  Fad<double>::operator=
            (phi->fElem + 9,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)&local_138);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178._8_8_ = -3.0;
  dStack_168 = 0.0;
  local_f8.fadexpr_.left_.constant_ = 4.0;
  local_f8.fadexpr_.left_.defaultVal = 0.0;
  local_f8.fadexpr_.right_ = &local_118;
  local_88 = 4.0;
  dStack_80 = 0.0;
  local_a8 = (undefined1  [8])&local_d8;
  local_160 = (Fad<double> *)&local_138;
  local_d8.fadexpr_.right_ = &local_f8;
  local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
  local_78 = &local_c8;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_d8.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *)local_178;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_d8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_178;
  Fad<double>::operator=
            (dphi->fElem,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)local_a8);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178._8_8_ = -3.0;
  dStack_168 = 0.0;
  local_f8.fadexpr_.left_.constant_ = 4.0;
  local_f8.fadexpr_.left_.defaultVal = 0.0;
  local_f8.fadexpr_.right_ = &local_118;
  local_88 = 4.0;
  dStack_80 = 0.0;
  local_a8 = (undefined1  [8])&local_d8;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_160 = (Fad<double> *)&local_138;
    local_d8.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *)local_178;
    local_d8.fadexpr_.right_ = &local_f8;
    local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
    local_78 = &local_c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_160 = (Fad<double> *)&local_138;
  local_d8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_178;
  local_d8.fadexpr_.right_ = &local_f8;
  local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
  local_78 = &local_c8;
  Fad<double>::operator=
            (dphi->fElem + 1,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)local_a8);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178._8_8_ = -3.0;
  dStack_168 = 0.0;
  local_f8.fadexpr_.left_.constant_ = 4.0;
  local_f8.fadexpr_.left_.defaultVal = 0.0;
  local_f8.fadexpr_.right_ = &local_118;
  local_88 = 4.0;
  dStack_80 = 0.0;
  local_a8 = (undefined1  [8])&local_d8;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_160 = (Fad<double> *)&local_138;
    local_d8.fadexpr_.left_ =
         (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
          *)local_178;
    local_d8.fadexpr_.right_ = &local_f8;
    local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
    local_78 = &local_c8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_160 = (Fad<double> *)&local_138;
  local_d8.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_178;
  local_d8.fadexpr_.right_ = &local_f8;
  local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
  local_78 = &local_c8;
  Fad<double>::operator=
            (dphi->fElem + 2,
             (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)local_a8);
  local_138.fadexpr_.left_.constant_ = 4.0;
  local_138.fadexpr_.left_.defaultVal = 0.0;
  local_138.fadexpr_.right_ = &local_158;
  local_178._8_8_ = -1.0;
  dStack_168 = 0.0;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    local_160 = (Fad<double> *)&local_138;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_160 = (Fad<double> *)&local_138;
  Fad<double>::operator=
            (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow,
             (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
              *)local_178);
  if ((1 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
     (1 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 + 1].val_ = 0.0;
    if (pFVar2[lVar3 + 1].dx_.num_elts != 0) {
      local_178._0_8_ = 0.0;
      Vector<double>::operator=(&pFVar2[lVar3 + 1].dx_,(double *)local_178);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 + 2].val_ = 0.0;
    if (pFVar2[lVar3 + 2].dx_.num_elts != 0) {
      local_178._0_8_ = 0.0;
      Vector<double>::operator=(&pFVar2[lVar3 + 2].dx_,(double *)local_178);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 2].val_ = 0.0;
    if (pFVar2[lVar3 * 2].dx_.num_elts != 0) {
      local_178._0_8_ = 0.0;
      Vector<double>::operator=(&pFVar2[lVar3 * 2].dx_,(double *)local_178);
    }
    local_138.fadexpr_.left_.constant_ = 4.0;
    local_138.fadexpr_.left_.defaultVal = 0.0;
    local_138.fadexpr_.right_ = &local_118;
    local_178._8_8_ = -1.0;
    dStack_168 = 0.0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      local_160 = (Fad<double> *)&local_138;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_160 = (Fad<double> *)&local_138;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 2 + 1,
               (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                *)local_178);
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 2 + 2].val_ = 0.0;
    if (pFVar2[lVar3 * 2 + 2].dx_.num_elts != 0) {
      local_178._0_8_ = 0.0;
      Vector<double>::operator=(&pFVar2[lVar3 * 2 + 2].dx_,(double *)local_178);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 3].val_ = 0.0;
    if (pFVar2[lVar3 * 3].dx_.num_elts != 0) {
      local_178._0_8_ = 0.0;
      Vector<double>::operator=(&pFVar2[lVar3 * 3].dx_,(double *)local_178);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar3 * 3 + 1].val_ = 0.0;
    if (pFVar2[lVar3 * 3 + 1].dx_.num_elts != 0) {
      local_178._0_8_ = 0.0;
      Vector<double>::operator=(&pFVar2[lVar3 * 3 + 1].dx_,(double *)local_178);
    }
    local_138.fadexpr_.left_.constant_ = 4.0;
    local_138.fadexpr_.left_.defaultVal = 0.0;
    local_178._8_8_ = -1.0;
    dStack_168 = 0.0;
    local_138.fadexpr_.right_ = &local_c8;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      local_160 = (Fad<double> *)&local_138;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_160 = (Fad<double> *)&local_138;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 3 + 2,
               (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                *)local_178);
    local_138.fadexpr_.left_.constant_ = 2.0;
    local_138.fadexpr_.left_.defaultVal = 0.0;
    local_138.fadexpr_.right_ = &local_158;
    local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_118;
    local_f8.fadexpr_.left_.constant_ = 1.0;
    local_f8.fadexpr_.left_.defaultVal = 0.0;
    local_178._8_8_ = -4.0;
    dStack_168 = 0.0;
    local_160 = (Fad<double> *)&local_f8;
    local_f8._0_8_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_90;
    local_a8 = (undefined1  [8])&local_138;
    local_90 = (undefined1  [8])local_a8;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      local_88 = (double)&local_c8;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_88 = (double)&local_c8;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 4,
               (FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                *)local_178);
    iVar4 = local_158.dx_.num_elts;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    uVar8 = (ulong)(uint)local_158.dx_.num_elts;
    uVar1 = pFVar2[lVar3 * 4 + 1].dx_.num_elts;
    if (local_158.dx_.num_elts != uVar1) {
      if (local_158.dx_.num_elts == 0) {
        if (uVar1 != 0) {
          pdVar6 = pFVar2[lVar3 * 4 + 1].dx_.ptr_to_data;
          if (pdVar6 != (double *)0x0) {
            operator_delete__(pdVar6);
          }
          pFVar2[lVar3 * 4 + 1].dx_.num_elts = 0;
          pFVar2[lVar3 * 4 + 1].dx_.ptr_to_data = (double *)0x0;
        }
      }
      else {
        lVar9 = (long)local_158.dx_.num_elts;
        if (uVar1 != 0) {
          pdVar6 = pFVar2[lVar3 * 4 + 1].dx_.ptr_to_data;
          if (pdVar6 != (double *)0x0) {
            operator_delete__(pdVar6);
          }
          pFVar2[lVar3 * 4 + 1].dx_.num_elts = 0;
          pFVar2[lVar3 * 4 + 1].dx_.ptr_to_data = (double *)0x0;
        }
        pFVar2[lVar3 * 4 + 1].dx_.num_elts = iVar4;
        uVar7 = 0xffffffffffffffff;
        if (-1 < iVar4) {
          uVar7 = lVar9 << 3;
        }
        pdVar6 = (double *)operator_new__(uVar7);
        pFVar2[lVar3 * 4 + 1].dx_.ptr_to_data = pdVar6;
      }
    }
    iVar5 = local_158.dx_.num_elts;
    if (iVar4 != 0) {
      pdVar6 = pFVar2[lVar3 * 4 + 1].dx_.ptr_to_data;
      if (local_158.dx_.num_elts == 0) {
        if (0 < iVar4) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = local_158.defaultVal * -4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      else if (0 < iVar4) {
        uVar7 = 0;
        do {
          pdVar6[uVar7] = *(double *)((long)local_158.dx_.ptr_to_data + uVar7 * 8) * -4.0;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
    pFVar2[lVar3 * 4 + 1].val_ = local_158.val_ * -4.0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    uVar8 = (ulong)(uint)local_158.dx_.num_elts;
    uVar1 = pFVar2[lVar3 * 4 + 2].dx_.num_elts;
    if (local_158.dx_.num_elts != uVar1) {
      if (local_158.dx_.num_elts == 0) {
        if (uVar1 != 0) {
          pdVar6 = pFVar2[lVar3 * 4 + 2].dx_.ptr_to_data;
          if (pdVar6 != (double *)0x0) {
            operator_delete__(pdVar6);
          }
          pFVar2[lVar3 * 4 + 2].dx_.num_elts = 0;
          pFVar2[lVar3 * 4 + 2].dx_.ptr_to_data = (double *)0x0;
        }
      }
      else {
        lVar9 = (long)local_158.dx_.num_elts;
        if (uVar1 != 0) {
          pdVar6 = pFVar2[lVar3 * 4 + 2].dx_.ptr_to_data;
          if (pdVar6 != (double *)0x0) {
            operator_delete__(pdVar6);
          }
          pFVar2[lVar3 * 4 + 2].dx_.num_elts = 0;
          pFVar2[lVar3 * 4 + 2].dx_.ptr_to_data = (double *)0x0;
        }
        pFVar2[lVar3 * 4 + 2].dx_.num_elts = iVar5;
        uVar7 = 0xffffffffffffffff;
        if (-1 < iVar5) {
          uVar7 = lVar9 << 3;
        }
        pdVar6 = (double *)operator_new__(uVar7);
        pFVar2[lVar3 * 4 + 2].dx_.ptr_to_data = pdVar6;
      }
    }
    iVar4 = local_118.dx_.num_elts;
    if (iVar5 != 0) {
      pdVar6 = pFVar2[lVar3 * 4 + 2].dx_.ptr_to_data;
      if (local_158.dx_.num_elts == 0) {
        if (0 < iVar5) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = local_158.defaultVal * -4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      else if (0 < iVar5) {
        uVar7 = 0;
        do {
          pdVar6[uVar7] = *(double *)((long)local_158.dx_.ptr_to_data + uVar7 * 8) * -4.0;
          uVar7 = uVar7 + 1;
        } while (uVar8 != uVar7);
      }
    }
    pFVar2[lVar3 * 4 + 2].val_ = local_158.val_ * -4.0;
    if ((0 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
       (5 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      uVar8 = (ulong)(uint)local_118.dx_.num_elts;
      uVar1 = pFVar2[lVar3 * 5].dx_.num_elts;
      if (local_118.dx_.num_elts != uVar1) {
        if (local_118.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 5].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 5].dx_.num_elts = 0;
            pFVar2[lVar3 * 5].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar9 = (long)local_118.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 5].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 5].dx_.num_elts = 0;
            pFVar2[lVar3 * 5].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar2[lVar3 * 5].dx_.num_elts = iVar4;
          uVar7 = 0xffffffffffffffff;
          if (-1 < iVar4) {
            uVar7 = lVar9 << 3;
          }
          pdVar6 = (double *)operator_new__(uVar7);
          pFVar2[lVar3 * 5].dx_.ptr_to_data = pdVar6;
        }
      }
      iVar5 = local_158.dx_.num_elts;
      if (iVar4 != 0) {
        pdVar6 = pFVar2[lVar3 * 5].dx_.ptr_to_data;
        if (local_118.dx_.num_elts == 0) {
          if (0 < iVar4) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = local_118.defaultVal * 4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else if (0 < iVar4) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = *(double *)((long)local_118.dx_.ptr_to_data + uVar7 * 8) * 4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar2[lVar3 * 5].val_ = local_118.val_ * 4.0;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      uVar8 = (ulong)(uint)local_158.dx_.num_elts;
      uVar1 = pFVar2[lVar3 * 5 + 1].dx_.num_elts;
      if (local_158.dx_.num_elts != uVar1) {
        if (local_158.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 5 + 1].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 5 + 1].dx_.num_elts = 0;
            pFVar2[lVar3 * 5 + 1].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar9 = (long)local_158.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 5 + 1].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 5 + 1].dx_.num_elts = 0;
            pFVar2[lVar3 * 5 + 1].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar2[lVar3 * 5 + 1].dx_.num_elts = iVar5;
          uVar7 = 0xffffffffffffffff;
          if (-1 < iVar5) {
            uVar7 = lVar9 << 3;
          }
          pdVar6 = (double *)operator_new__(uVar7);
          pFVar2[lVar3 * 5 + 1].dx_.ptr_to_data = pdVar6;
        }
      }
      if (iVar5 != 0) {
        pdVar6 = pFVar2[lVar3 * 5 + 1].dx_.ptr_to_data;
        if (local_158.dx_.num_elts == 0) {
          if (0 < iVar5) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = local_158.defaultVal * 4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else if (0 < iVar5) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = *(double *)((long)local_158.dx_.ptr_to_data + uVar7 * 8) * 4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar2[lVar3 * 5 + 1].val_ = local_158.val_ * 4.0;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      pFVar2[lVar3 * 5 + 2].val_ = 0.0;
      if (pFVar2[lVar3 * 5 + 2].dx_.num_elts != 0) {
        local_178._0_8_ = 0.0;
        Vector<double>::operator=(&pFVar2[lVar3 * 5 + 2].dx_,(double *)local_178);
      }
      iVar4 = local_118.dx_.num_elts;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      uVar8 = (ulong)(uint)local_118.dx_.num_elts;
      uVar1 = pFVar2[lVar3 * 6].dx_.num_elts;
      if (local_118.dx_.num_elts != uVar1) {
        if (local_118.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 6].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 6].dx_.num_elts = 0;
            pFVar2[lVar3 * 6].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar9 = (long)local_118.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 6].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 6].dx_.num_elts = 0;
            pFVar2[lVar3 * 6].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar2[lVar3 * 6].dx_.num_elts = iVar4;
          uVar7 = 0xffffffffffffffff;
          if (-1 < iVar4) {
            uVar7 = lVar9 << 3;
          }
          pdVar6 = (double *)operator_new__(uVar7);
          pFVar2[lVar3 * 6].dx_.ptr_to_data = pdVar6;
        }
      }
      local_160 = (Fad<double> *)&local_f8;
      if (iVar4 != 0) {
        pdVar6 = pFVar2[lVar3 * 6].dx_.ptr_to_data;
        if (local_118.dx_.num_elts == 0) {
          if (0 < iVar4) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = local_118.defaultVal * -4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else if (0 < iVar4) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = *(double *)((long)local_118.dx_.ptr_to_data + uVar7 * 8) * -4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar2[lVar3 * 6].val_ = local_118.val_ * -4.0;
      local_d8.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)&local_158;
      local_138.fadexpr_.right_ = &local_118;
      local_a8 = (undefined1  [8])&local_d8;
      local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_c8;
      local_f8._0_8_ = local_a8;
      local_f8.fadexpr_.left_.constant_ = 1.0;
      local_f8.fadexpr_.left_.defaultVal = 0.0;
      local_178._8_8_ = -4.0;
      dStack_168 = 0.0;
      local_138.fadexpr_.left_.constant_ = 4.0;
      local_138.fadexpr_.left_.defaultVal = 0.0;
      local_d8.fadexpr_.right_ =
           (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_138.fadexpr_.right_;
      local_88 = (double)&local_138;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
        local_90 = (undefined1  [8])local_178;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_90 = (undefined1  [8])local_178;
      Fad<double>::operator=
                (dphi->fElem +
                 (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 6 + 1,
                 (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                  *)local_90);
      iVar4 = local_118.dx_.num_elts;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      uVar8 = (ulong)(uint)local_118.dx_.num_elts;
      uVar1 = pFVar2[lVar3 * 6 + 2].dx_.num_elts;
      if (local_118.dx_.num_elts != uVar1) {
        if (local_118.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 6 + 2].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 6 + 2].dx_.num_elts = 0;
            pFVar2[lVar3 * 6 + 2].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar9 = (long)local_118.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 6 + 2].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 6 + 2].dx_.num_elts = 0;
            pFVar2[lVar3 * 6 + 2].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar2[lVar3 * 6 + 2].dx_.num_elts = iVar4;
          uVar7 = 0xffffffffffffffff;
          if (-1 < iVar4) {
            uVar7 = lVar9 << 3;
          }
          pdVar6 = (double *)operator_new__(uVar7);
          pFVar2[lVar3 * 6 + 2].dx_.ptr_to_data = pdVar6;
        }
      }
      iVar5 = local_c8.dx_.num_elts;
      if (iVar4 != 0) {
        pdVar6 = pFVar2[lVar3 * 6 + 2].dx_.ptr_to_data;
        if (local_118.dx_.num_elts == 0) {
          if (0 < iVar4) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = local_118.defaultVal * -4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else if (0 < iVar4) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = *(double *)((long)local_118.dx_.ptr_to_data + uVar7 * 8) * -4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar2[lVar3 * 6 + 2].val_ = local_118.val_ * -4.0;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      uVar8 = (ulong)(uint)local_c8.dx_.num_elts;
      uVar1 = pFVar2[lVar3 * 7].dx_.num_elts;
      if (local_c8.dx_.num_elts != uVar1) {
        if (local_c8.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 7].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 7].dx_.num_elts = 0;
            pFVar2[lVar3 * 7].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar9 = (long)local_c8.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 7].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 7].dx_.num_elts = 0;
            pFVar2[lVar3 * 7].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar2[lVar3 * 7].dx_.num_elts = iVar5;
          uVar7 = 0xffffffffffffffff;
          if (-1 < iVar5) {
            uVar7 = lVar9 << 3;
          }
          pdVar6 = (double *)operator_new__(uVar7);
          pFVar2[lVar3 * 7].dx_.ptr_to_data = pdVar6;
        }
      }
      iVar4 = local_c8.dx_.num_elts;
      if (iVar5 != 0) {
        pdVar6 = pFVar2[lVar3 * 7].dx_.ptr_to_data;
        if (local_c8.dx_.num_elts == 0) {
          if (0 < iVar5) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = local_c8.defaultVal * -4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else if (0 < iVar5) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = *(double *)((long)local_c8.dx_.ptr_to_data + uVar7 * 8) * -4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar2[lVar3 * 7].val_ = local_c8.val_ * -4.0;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      uVar8 = (ulong)(uint)local_c8.dx_.num_elts;
      uVar1 = pFVar2[lVar3 * 7 + 1].dx_.num_elts;
      if (local_c8.dx_.num_elts != uVar1) {
        if (local_c8.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 7 + 1].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 7 + 1].dx_.num_elts = 0;
            pFVar2[lVar3 * 7 + 1].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar9 = (long)local_c8.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 7 + 1].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 7 + 1].dx_.num_elts = 0;
            pFVar2[lVar3 * 7 + 1].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar2[lVar3 * 7 + 1].dx_.num_elts = iVar4;
          uVar7 = 0xffffffffffffffff;
          if (-1 < iVar4) {
            uVar7 = lVar9 << 3;
          }
          pdVar6 = (double *)operator_new__(uVar7);
          pFVar2[lVar3 * 7 + 1].dx_.ptr_to_data = pdVar6;
        }
      }
      local_160 = (Fad<double> *)&local_f8;
      if (iVar4 != 0) {
        pdVar6 = pFVar2[lVar3 * 7 + 1].dx_.ptr_to_data;
        if (local_c8.dx_.num_elts == 0) {
          if (0 < iVar4) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = local_c8.defaultVal * -4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else if (0 < iVar4) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = *(double *)((long)local_c8.dx_.ptr_to_data + uVar7 * 8) * -4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar2[lVar3 * 7 + 1].val_ = local_c8.val_ * -4.0;
      local_d8.fadexpr_.left_ =
           (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
            *)&local_158;
      local_d8.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&local_118;
      local_a8 = (undefined1  [8])&local_d8;
      local_138.fadexpr_.right_ = &local_c8;
      local_f8._0_8_ = local_a8;
      local_f8.fadexpr_.left_.constant_ = 1.0;
      local_f8.fadexpr_.left_.defaultVal = 0.0;
      local_178._8_8_ = -4.0;
      dStack_168 = 0.0;
      local_138.fadexpr_.left_.constant_ = 4.0;
      local_138.fadexpr_.left_.defaultVal = 0.0;
      local_a0 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_138.fadexpr_.right_;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
        local_90 = (undefined1  [8])local_178;
        local_88 = (double)&local_138;
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_90 = (undefined1  [8])local_178;
      local_88 = (double)&local_138;
      Fad<double>::operator=
                (dphi->fElem +
                 (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 7 + 2,
                 (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                  *)local_90);
      iVar4 = local_c8.dx_.num_elts;
      if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
         ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
      pFVar2 = dphi->fElem;
      uVar8 = (ulong)(uint)local_c8.dx_.num_elts;
      uVar1 = pFVar2[lVar3 * 8].dx_.num_elts;
      if (local_c8.dx_.num_elts != uVar1) {
        if (local_c8.dx_.num_elts == 0) {
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 8].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 8].dx_.num_elts = 0;
            pFVar2[lVar3 * 8].dx_.ptr_to_data = (double *)0x0;
          }
        }
        else {
          lVar9 = (long)local_c8.dx_.num_elts;
          if (uVar1 != 0) {
            pdVar6 = pFVar2[lVar3 * 8].dx_.ptr_to_data;
            if (pdVar6 != (double *)0x0) {
              operator_delete__(pdVar6);
            }
            pFVar2[lVar3 * 8].dx_.num_elts = 0;
            pFVar2[lVar3 * 8].dx_.ptr_to_data = (double *)0x0;
          }
          pFVar2[lVar3 * 8].dx_.num_elts = iVar4;
          uVar7 = 0xffffffffffffffff;
          if (-1 < iVar4) {
            uVar7 = lVar9 << 3;
          }
          pdVar6 = (double *)operator_new__(uVar7);
          pFVar2[lVar3 * 8].dx_.ptr_to_data = pdVar6;
        }
      }
      if (iVar4 != 0) {
        pdVar6 = pFVar2[lVar3 * 8].dx_.ptr_to_data;
        if (local_c8.dx_.num_elts == 0) {
          if (0 < iVar4) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = local_c8.defaultVal * 4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        else if (0 < iVar4) {
          uVar7 = 0;
          do {
            pdVar6[uVar7] = *(double *)((long)local_c8.dx_.ptr_to_data + uVar7 * 8) * 4.0;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
      pFVar2[lVar3 * 8].val_ = local_c8.val_ * 4.0;
      if ((1 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
         (8 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
        lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        pFVar2 = dphi->fElem;
        pFVar2[lVar3 * 8 + 1].val_ = 0.0;
        if (pFVar2[lVar3 * 8 + 1].dx_.num_elts != 0) {
          local_178._0_8_ = 0.0;
          Vector<double>::operator=(&pFVar2[lVar3 * 8 + 1].dx_,(double *)local_178);
        }
        iVar4 = local_158.dx_.num_elts;
        if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
           ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
        pFVar2 = dphi->fElem;
        uVar8 = (ulong)(uint)local_158.dx_.num_elts;
        uVar1 = pFVar2[lVar3 * 8 + 2].dx_.num_elts;
        if (local_158.dx_.num_elts != uVar1) {
          if (local_158.dx_.num_elts == 0) {
            if (uVar1 != 0) {
              pdVar6 = pFVar2[lVar3 * 8 + 2].dx_.ptr_to_data;
              if (pdVar6 != (double *)0x0) {
                operator_delete__(pdVar6);
              }
              pFVar2[lVar3 * 8 + 2].dx_.num_elts = 0;
              pFVar2[lVar3 * 8 + 2].dx_.ptr_to_data = (double *)0x0;
            }
          }
          else {
            lVar9 = (long)local_158.dx_.num_elts;
            if (uVar1 != 0) {
              pdVar6 = pFVar2[lVar3 * 8 + 2].dx_.ptr_to_data;
              if (pdVar6 != (double *)0x0) {
                operator_delete__(pdVar6);
              }
              pFVar2[lVar3 * 8 + 2].dx_.num_elts = 0;
              pFVar2[lVar3 * 8 + 2].dx_.ptr_to_data = (double *)0x0;
            }
            pFVar2[lVar3 * 8 + 2].dx_.num_elts = iVar4;
            uVar7 = 0xffffffffffffffff;
            if (-1 < iVar4) {
              uVar7 = lVar9 << 3;
            }
            pdVar6 = (double *)operator_new__(uVar7);
            pFVar2[lVar3 * 8 + 2].dx_.ptr_to_data = pdVar6;
          }
        }
        if (iVar4 != 0) {
          pdVar6 = pFVar2[lVar3 * 8 + 2].dx_.ptr_to_data;
          if (local_158.dx_.num_elts == 0) {
            if (0 < iVar4) {
              uVar7 = 0;
              do {
                pdVar6[uVar7] = local_158.defaultVal * 4.0;
                uVar7 = uVar7 + 1;
              } while (uVar8 != uVar7);
            }
          }
          else if (0 < iVar4) {
            uVar7 = 0;
            do {
              pdVar6[uVar7] = *(double *)((long)local_158.dx_.ptr_to_data + uVar7 * 8) * 4.0;
              uVar7 = uVar7 + 1;
            } while (uVar8 != uVar7);
          }
        }
        pFVar2[lVar3 * 8 + 2].val_ = local_158.val_ * 4.0;
        if ((0 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
           (9 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
          lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          pFVar2 = dphi->fElem;
          pFVar2[lVar3 * 9].val_ = 0.0;
          if (pFVar2[lVar3 * 9].dx_.num_elts != 0) {
            local_178._0_8_ = 0.0;
            Vector<double>::operator=(&pFVar2[lVar3 * 9].dx_,(double *)local_178);
          }
          iVar4 = local_c8.dx_.num_elts;
          if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
             ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
            TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
          pFVar2 = dphi->fElem;
          uVar8 = (ulong)(uint)local_c8.dx_.num_elts;
          uVar1 = pFVar2[lVar3 * 9 + 1].dx_.num_elts;
          if (local_c8.dx_.num_elts != uVar1) {
            if (local_c8.dx_.num_elts == 0) {
              if (uVar1 != 0) {
                pdVar6 = pFVar2[lVar3 * 9 + 1].dx_.ptr_to_data;
                if (pdVar6 != (double *)0x0) {
                  operator_delete__(pdVar6);
                }
                pFVar2[lVar3 * 9 + 1].dx_.num_elts = 0;
                pFVar2[lVar3 * 9 + 1].dx_.ptr_to_data = (double *)0x0;
              }
            }
            else {
              lVar9 = (long)local_c8.dx_.num_elts;
              if (uVar1 != 0) {
                pdVar6 = pFVar2[lVar3 * 9 + 1].dx_.ptr_to_data;
                if (pdVar6 != (double *)0x0) {
                  operator_delete__(pdVar6);
                }
                pFVar2[lVar3 * 9 + 1].dx_.num_elts = 0;
                pFVar2[lVar3 * 9 + 1].dx_.ptr_to_data = (double *)0x0;
              }
              pFVar2[lVar3 * 9 + 1].dx_.num_elts = iVar4;
              uVar7 = 0xffffffffffffffff;
              if (-1 < iVar4) {
                uVar7 = lVar9 << 3;
              }
              pdVar6 = (double *)operator_new__(uVar7);
              pFVar2[lVar3 * 9 + 1].dx_.ptr_to_data = pdVar6;
            }
          }
          iVar5 = local_118.dx_.num_elts;
          if (iVar4 != 0) {
            pdVar6 = pFVar2[lVar3 * 9 + 1].dx_.ptr_to_data;
            if (local_c8.dx_.num_elts == 0) {
              if (0 < iVar4) {
                uVar7 = 0;
                do {
                  pdVar6[uVar7] = local_c8.defaultVal * 4.0;
                  uVar7 = uVar7 + 1;
                } while (uVar8 != uVar7);
              }
            }
            else if (0 < iVar4) {
              uVar7 = 0;
              do {
                pdVar6[uVar7] = *(double *)((long)local_c8.dx_.ptr_to_data + uVar7 * 8) * 4.0;
                uVar7 = uVar7 + 1;
              } while (uVar8 != uVar7);
            }
          }
          pFVar2[lVar3 * 9 + 1].val_ = local_c8.val_ * 4.0;
          if ((2 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow) &&
             (9 < (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol)) {
            lVar3 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
            pFVar2 = dphi->fElem;
            uVar8 = (ulong)(uint)local_118.dx_.num_elts;
            uVar1 = pFVar2[lVar3 * 9 + 2].dx_.num_elts;
            if (local_118.dx_.num_elts != uVar1) {
              if (local_118.dx_.num_elts == 0) {
                if (uVar1 != 0) {
                  pdVar6 = pFVar2[lVar3 * 9 + 2].dx_.ptr_to_data;
                  if (pdVar6 != (double *)0x0) {
                    operator_delete__(pdVar6);
                  }
                  pFVar2[lVar3 * 9 + 2].dx_.num_elts = 0;
                  pFVar2[lVar3 * 9 + 2].dx_.ptr_to_data = (double *)0x0;
                }
              }
              else {
                lVar9 = (long)local_118.dx_.num_elts;
                if (uVar1 != 0) {
                  pdVar6 = pFVar2[lVar3 * 9 + 2].dx_.ptr_to_data;
                  if (pdVar6 != (double *)0x0) {
                    operator_delete__(pdVar6);
                  }
                  pFVar2[lVar3 * 9 + 2].dx_.num_elts = 0;
                  pFVar2[lVar3 * 9 + 2].dx_.ptr_to_data = (double *)0x0;
                }
                pFVar2[lVar3 * 9 + 2].dx_.num_elts = iVar5;
                uVar7 = 0xffffffffffffffff;
                if (-1 < iVar5) {
                  uVar7 = lVar9 << 3;
                }
                pdVar6 = (double *)operator_new__(uVar7);
                pFVar2[lVar3 * 9 + 2].dx_.ptr_to_data = pdVar6;
              }
            }
            if (iVar5 != 0) {
              pdVar6 = pFVar2[lVar3 * 9 + 2].dx_.ptr_to_data;
              if (local_118.dx_.num_elts == 0) {
                if (0 < iVar5) {
                  uVar7 = 0;
                  do {
                    pdVar6[uVar7] = local_118.defaultVal * 4.0;
                    uVar7 = uVar7 + 1;
                  } while (uVar8 != uVar7);
                }
              }
              else if (0 < iVar5) {
                uVar7 = 0;
                do {
                  pdVar6[uVar7] = *(double *)((long)local_118.dx_.ptr_to_data + uVar7 * 8) * 4.0;
                  uVar7 = uVar7 + 1;
                } while (uVar8 != uVar7);
              }
            }
            pFVar2[lVar3 * 9 + 2].val_ = local_118.val_ * 4.0;
            Fad<double>::~Fad(&local_c8);
            Fad<double>::~Fad(&local_118);
            Fad<double>::~Fad(&local_158);
            return;
          }
          TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZQuadraticTetra::TShape(const TPZVec<T> &par, TPZFMatrix<T> &phi, TPZFMatrix<T> &dphi)
{
	T qsi = par[0], eta = par[1], zeta = par[2];
	
    phi(0,0)  =  (zeta + eta + qsi -1.) * (2.*zeta + 2.*eta + 2.*qsi - 1.);
//    phi(0,0)  =  (qsi + eta + zeta -1.) * (2.*qsi + 2.*eta + 2.*zeta - 1.);
//    phi(0,0)  =  2.*qsi*qsi + 2.*eta*eta + 2.*zeta*zeta + 4.*qsi*eta + 4.*qsi*zeta + 4.*eta*zeta - 3.*qsi - 3.*eta - 3.*zeta + 1.;
	phi(1,0)  =  qsi  * (2.*qsi - 1.);
	phi(2,0)  =  eta  * (2.*eta - 1.);
	phi(3,0)  =  zeta * (2.*zeta - 1.);
	phi(4,0)  = -4.*qsi  * (qsi + eta + zeta -1.);
	phi(5,0)  =  4.*qsi  *  eta;
	phi(6,0)  = -4.*eta  * (qsi + eta + zeta -1.);
	phi(7,0)  = -4.*zeta * (qsi + eta + zeta -1.);
	phi(8,0)  =  4.*qsi  *  zeta;
	phi(9,0)  =  4.*eta  *  zeta;
	
	dphi(0,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(1,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(2,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(0,1) =  -1. + 4.*qsi;
	dphi(1,1) =   0.;
	dphi(2,1) =   0.;
	dphi(0,2) =   0.;
	dphi(1,2) =  -1. + 4.*eta;
	dphi(2,2) =   0.;
	dphi(0,3) =   0.;
	dphi(1,3) =   0.;
	dphi(2,3) =  -1. + 4.*zeta;
	dphi(0,4) =  -4.*(2.*qsi + eta + zeta - 1.);
	dphi(1,4) =  -4.*qsi;
	dphi(2,4) =  -4.*qsi;
	dphi(0,5) =   4.*eta;
	dphi(1,5) =   4.*qsi;
	dphi(2,5) =   0.;
	dphi(0,6) =  -4.*eta;
	dphi(1,6) =  -4.*(qsi + eta + zeta - 1.)-4.*eta;
	dphi(2,6) =  -4.*eta;
	dphi(0,7) =  -4.*zeta;
	dphi(1,7) =  -4.*zeta;
	dphi(2,7) =  -4.*(qsi + eta + zeta - 1.)-4.*zeta;
	dphi(0,8) =   4.*zeta;
	dphi(1,8) =   0.;
	dphi(2,8) =   4.*qsi;
	dphi(0,9) =   0.;
	dphi(1,9) =   4.*zeta;
	dphi(2,9) =   4.*eta;
}